

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.cc
# Opt level: O1

void __thiscall AddrSpaceManager::~AddrSpaceManager(AddrSpaceManager *this)

{
  AddrSpace *pAVar1;
  JoinRecord *pJVar2;
  pointer pVVar3;
  pointer ppAVar4;
  pointer ppJVar5;
  pointer ppAVar6;
  ulong uVar7;
  
  this->_vptr_AddrSpaceManager = (_func_int **)&PTR__AddrSpaceManager_003bd878;
  ppAVar6 = (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar6 !=
      (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pAVar1 = *ppAVar6;
      if (pAVar1 != (AddrSpace *)0x0) {
        if (pAVar1->refcount < 2) {
          (*pAVar1->_vptr_AddrSpace[1])();
        }
        else {
          pAVar1->refcount = pAVar1->refcount + -1;
        }
      }
      ppAVar6 = ppAVar6 + 1;
    } while (ppAVar6 !=
             (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppAVar4 = (this->resolvelist).
            super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->resolvelist).super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppAVar4) {
    uVar7 = 0;
    do {
      if (ppAVar4[uVar7] != (AddressResolver *)0x0) {
        (*ppAVar4[uVar7]->_vptr_AddressResolver[1])();
      }
      uVar7 = uVar7 + 1;
      ppAVar4 = (this->resolvelist).
                super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->resolvelist).
                                   super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar4 >> 3))
    ;
  }
  ppJVar5 = (this->splitlist).super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->splitlist).super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar5) {
    uVar7 = 0;
    do {
      pJVar2 = ppJVar5[uVar7];
      if (pJVar2 != (JoinRecord *)0x0) {
        pVVar3 = (pJVar2->pieces).super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pVVar3 != (pointer)0x0) {
          operator_delete(pVVar3);
        }
        operator_delete(pJVar2);
      }
      uVar7 = uVar7 + 1;
      ppJVar5 = (this->splitlist).super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->splitlist).
                                   super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppJVar5 >> 3));
  }
  if (ppJVar5 != (pointer)0x0) {
    operator_delete(ppJVar5);
  }
  std::
  _Rb_tree<JoinRecord_*,_JoinRecord_*,_std::_Identity<JoinRecord_*>,_JoinRecordCompare,_std::allocator<JoinRecord_*>_>
  ::~_Rb_tree(&(this->splitset)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_AddrSpace_*>,_std::_Select1st<std::pair<const_int,_AddrSpace_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_AddrSpace_*>_>_>
  ::~_Rb_tree(&(this->shortcut2Space)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>_>_>
  ::~_Rb_tree(&(this->name2Space)._M_t);
  ppAVar4 = (this->resolvelist).
            super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar4 != (pointer)0x0) {
    operator_delete(ppAVar4);
  }
  ppAVar6 = (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar6 != (pointer)0x0) {
    operator_delete(ppAVar6);
    return;
  }
  return;
}

Assistant:

AddrSpaceManager::~AddrSpaceManager(void)

{
  for(vector<AddrSpace *>::iterator iter=baselist.begin();iter!=baselist.end();++iter) {
    AddrSpace *spc = *iter;
    if (spc == (AddrSpace *)0) continue;
    if (spc->refcount > 1)
      spc->refcount -= 1;
    else
      delete spc;
  }
  for(int4 i=0;i<resolvelist.size();++i) {
    if (resolvelist[i] != (AddressResolver *)0)
      delete resolvelist[i];
  }
  for(int4 i=0;i<splitlist.size();++i)
    delete splitlist[i];	// Delete any join records
}